

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZipArchiveIOSystem.cpp
# Opt level: O1

IOStream * __thiscall
Assimp::ZipArchiveIOSystem::Open(ZipArchiveIOSystem *this,char *pFilename,char *pMode)

{
  size_t sVar1;
  IOStream *pIVar2;
  string filename;
  string local_40;
  
  if (pFilename == (char *)0x0) {
    __assert_fail("pFilename != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                  ,0x1f5,
                  "virtual IOStream *Assimp::ZipArchiveIOSystem::Open(const char *, const char *)");
  }
  while( true ) {
    if (*pMode == '\0') {
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      sVar1 = strlen(pFilename);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,pFilename,pFilename + sVar1);
      pIVar2 = Implement::OpenFile(this->pImpl,&local_40);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      return pIVar2;
    }
    if (*pMode == 'w') break;
    pMode = pMode + 1;
  }
  __assert_fail("pMode[i] != \'w\'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Common/ZipArchiveIOSystem.cpp"
                ,0x1f9,
                "virtual IOStream *Assimp::ZipArchiveIOSystem::Open(const char *, const char *)");
}

Assistant:

IOStream * ZipArchiveIOSystem::Open(const char* pFilename, const char* pMode) {
        ai_assert(pFilename != nullptr);

        for (size_t i = 0; pMode[i] != 0; ++i)
        {
            ai_assert(pMode[i] != 'w');
            if (pMode[i] == 'w')
                return nullptr;
        }

        std::string filename(pFilename);
        return pImpl->OpenFile(filename);
    }